

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSop.c
# Opt level: O0

int Abc_SopGetLitNum(char *pSop)

{
  bool local_25;
  int local_24;
  char *pcStack_20;
  int nLits;
  char *pCur;
  char *pSop_local;
  
  local_24 = 0;
  pcStack_20 = pSop;
  if (pSop == (char *)0x0) {
    pSop_local._4_4_ = 0;
  }
  else {
    for (; *pcStack_20 != '\0'; pcStack_20 = pcStack_20 + 1) {
      local_25 = true;
      if (*pcStack_20 != '0') {
        local_25 = *pcStack_20 == '1';
      }
      local_24 = (uint)local_25 + (local_24 - (uint)(*pcStack_20 == '\n'));
    }
    pSop_local._4_4_ = local_24;
  }
  return pSop_local._4_4_;
}

Assistant:

int Abc_SopGetLitNum( char * pSop )
{
    char * pCur;
    int nLits = 0;
    if ( pSop == NULL )
        return 0;
    for ( pCur = pSop; *pCur; pCur++ )
    {
        nLits  -= (*pCur == '\n');
        nLits  += (*pCur == '0' || *pCur == '1');
    }
    return nLits;
}